

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O3

int cbs_convert_ber(CBS *in,CBB *out,CBS_ASN1_TAG string_tag,int looking_for_eoc,uint32_t depth)

{
  int iVar1;
  uint uVar2;
  CBS_ASN1_TAG tag_00;
  CBS *in_00;
  CBS_ASN1_TAG string_tag_00;
  CBB *out_contents;
  CBS_ASN1_TAG tag;
  int indefinite;
  CBS contents;
  size_t header_len;
  CBB out_contents_storage;
  uint local_80;
  int local_7c;
  CBS local_78;
  size_t local_68;
  CBB local_60;
  
  if ((string_tag >> 0x1d & 1) != 0) {
    __assert_fail("!(string_tag & CBS_ASN1_CONSTRUCTED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0x72,"int cbs_convert_ber(CBS *, CBB *, CBS_ASN1_TAG, int, uint32_t)");
  }
  if (depth < 0x81) {
    while( true ) {
      if (in->len == 0) {
        return (uint)(looking_for_eoc == 0);
      }
      if ((((in->len != 1 && looking_for_eoc != 0) && (*in->data == '\0')) && (in->data[1] == '\0'))
         && (iVar1 = CBS_skip(in,2), iVar1 != 0)) {
        return 1;
      }
      iVar1 = CBS_get_any_ber_asn1_element(in,&local_78,&local_80,&local_68,(int *)0x0,&local_7c);
      if (iVar1 == 0) break;
      if (string_tag == 0) {
        tag_00 = local_80;
        string_tag_00 = 0;
        if ((((local_80 >> 0x1d & 1) != 0) &&
            (uVar2 = (local_80 & 0xdfffffff) - 4, string_tag_00 = 0, uVar2 < 0x1b)) &&
           ((0x5e7c101U >> (uVar2 & 0x1f) & 1) != 0)) {
          tag_00 = *(CBS_ASN1_TAG *)(&DAT_003a3540 + (ulong)uVar2 * 4);
          string_tag_00 = tag_00;
        }
        out_contents = &local_60;
        iVar1 = CBB_add_asn1(out,out_contents,tag_00);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        out_contents = out;
        string_tag_00 = string_tag;
        if ((local_80 & 0xdfffffff) != string_tag) {
          return 0;
        }
      }
      if (local_7c == 0) {
        iVar1 = CBS_skip(&local_78,local_68);
        if (iVar1 == 0) {
          return 0;
        }
        if ((local_80 & 0x20000000) != 0) {
          in_00 = &local_78;
          iVar1 = 0;
          goto LAB_003099ce;
        }
        iVar1 = CBB_add_bytes(out_contents,local_78.data,local_78.len);
      }
      else {
        iVar1 = 1;
        in_00 = in;
LAB_003099ce:
        iVar1 = cbs_convert_ber(in_00,out_contents,string_tag_00,iVar1,depth + 1);
      }
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = CBB_flush(out);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int cbs_convert_ber(CBS *in, CBB *out, CBS_ASN1_TAG string_tag,
                           int looking_for_eoc, uint32_t depth) {
  assert(!(string_tag & CBS_ASN1_CONSTRUCTED));

  if (depth > kMaxDepth) {
    return 0;
  }

  while (CBS_len(in) > 0) {
    if (looking_for_eoc && cbs_get_eoc(in)) {
      return 1;
    }

    CBS contents;
    CBS_ASN1_TAG tag, child_string_tag = string_tag;
    size_t header_len;
    int indefinite;
    CBB *out_contents, out_contents_storage;
    if (!CBS_get_any_ber_asn1_element(in, &contents, &tag, &header_len,
                                      /*out_ber_found=*/NULL, &indefinite)) {
      return 0;
    }

    if (string_tag != 0) {
      // This is part of a constructed string. All elements must match
      // |string_tag| up to the constructed bit and get appended to |out|
      // without a child element.
      if ((tag & ~CBS_ASN1_CONSTRUCTED) != string_tag) {
        return 0;
      }
      out_contents = out;
    } else {
      CBS_ASN1_TAG out_tag = tag;
      if ((tag & CBS_ASN1_CONSTRUCTED) && is_string_type(tag)) {
        // If a constructed string, clear the constructed bit and inform
        // children to concatenate bodies.
        out_tag &= ~CBS_ASN1_CONSTRUCTED;
        child_string_tag = out_tag;
      }
      if (!CBB_add_asn1(out, &out_contents_storage, out_tag)) {
        return 0;
      }
      out_contents = &out_contents_storage;
    }

    if (indefinite) {
      if (!cbs_convert_ber(in, out_contents, child_string_tag,
                           /*looking_for_eoc=*/1, depth + 1) ||
          !CBB_flush(out)) {
        return 0;
      }
      continue;
    }

    if (!CBS_skip(&contents, header_len)) {
      return 0;
    }

    if (tag & CBS_ASN1_CONSTRUCTED) {
      // Recurse into children.
      if (!cbs_convert_ber(&contents, out_contents, child_string_tag,
                           /*looking_for_eoc=*/0, depth + 1)) {
        return 0;
      }
    } else {
      // Copy primitive contents as-is.
      if (!CBB_add_bytes(out_contents, CBS_data(&contents),
                         CBS_len(&contents))) {
        return 0;
      }
    }

    if (!CBB_flush(out)) {
      return 0;
    }
  }

  return looking_for_eoc == 0;
}